

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void set_response_header(http_context_t *ctx,char *key,char *value)

{
  nh_header_t *pnVar1;
  
  pnVar1 = (nh_header_t *)malloc(0x18);
  if (pnVar1 != (nh_header_t *)0x0) {
    pnVar1->key = key;
    pnVar1->value = value;
    pnVar1->next = (ctx->response).header;
    (ctx->response).header = pnVar1;
    return;
  }
  __assert_fail("h != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                ,0x19c,"void set_response_header(http_context_t *, const char *, const char *)");
}

Assistant:

void set_response_header(http_context_t *ctx, const char key[static 1], const char value[static 1]) {
    nh_header_t *h = (nh_header_t *) malloc(sizeof(nh_header_t));
    assert(h != NULL);
    h->key = key;
    h->value = value;
    h->next = ctx->response.header;
    ctx->response.header = h;
}